

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O2

string * __thiscall qclab::qasm_abi_cxx11_(string *__return_storage_ptr__,qclab *this,float angle)

{
  int iVar1;
  char buffer [16];
  char acStack_28 [24];
  
  iVar1 = sprintf(acStack_28,"%.7f",(double)angle);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_28,acStack_28 + iVar1);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm( const float angle ) {
    char buffer[16] ;
    int size = std::sprintf( buffer , "%.7f" , angle ) ;
    return std::string( buffer , size ) ;
  }